

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O0

void addsig(int sig)

{
  undefined1 local_a8 [8];
  sigaction sa;
  int sig_local;
  
  sa.sa_restorer._4_4_ = sig;
  memset(local_a8,0,0x98);
  local_a8 = (undefined1  [8])timerHandle;
  sa.sa_mask.__val[0xf]._0_4_ = (uint)sa.sa_mask.__val[0xf] | 0x10000000;
  sigfillset((sigset_t *)&sa);
  sigaction(sa.sa_restorer._4_4_,(sigaction *)local_a8,(sigaction *)0x0);
  return;
}

Assistant:

void addsig(int sig)
{
    struct sigaction sa;
    memset(&sa, 0, sizeof(sa));
    sa.sa_handler = timerHandle;
    sa.sa_flags |= SA_RESTART;
    sigfillset(&sa.sa_mask);
    sigaction(sig, &sa, NULL);
}